

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkCppSDK.h
# Opt level: O0

bool __thiscall
tonk::SDKConnectionList<MyP2PClientConnection>::Insert
          (SDKConnectionList<MyP2PClientConnection> *this,SDKConnection *connection)

{
  bool bVar1;
  __shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar2;
  element_type *in_RSI;
  vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  *in_RDI;
  shared_ptr<tonk::SDKConnection> *ii;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  *__range2;
  lock_guard<std::mutex> locker;
  mutex_type *in_stack_ffffffffffffff88;
  pointer *this_01;
  __normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
  local_30;
  pointer *local_28;
  element_type *local_18;
  byte local_1;
  
  local_18 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffff88);
  local_28 = &in_RDI[1].
              super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_30._M_current =
       (shared_ptr<tonk::SDKConnection> *)
       std::
       vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
       ::begin((vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                *)in_stack_ffffffffffffff88);
  std::
  vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
  ::end((vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
         *)in_stack_ffffffffffffff88);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
                        *)in_RDI,
                       (__normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
                        *)in_stack_ffffffffffffff88);
    if (!bVar1) {
      this_01 = &in_RDI[1].
                 super__Vector_base<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::enable_shared_from_this<tonk::SDKConnection>::shared_from_this
                ((enable_shared_from_this<tonk::SDKConnection> *)this_01);
      std::
      vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>
      ::push_back(in_RDI,(value_type *)this_01);
      std::shared_ptr<tonk::SDKConnection>::~shared_ptr((shared_ptr<tonk::SDKConnection> *)0x10f5bf)
      ;
      local_1 = 1;
LAB_0010f5f8:
      std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x10f602);
      return (bool)(local_1 & 1);
    }
    this_00 = &__gnu_cxx::
               __normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
               ::operator*(&local_30)->
               super___shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>;
    peVar2 = std::__shared_ptr<tonk::SDKConnection,_(__gnu_cxx::_Lock_policy)2>::get(this_00);
    if (peVar2 == local_18) {
      local_1 = 0;
      goto LAB_0010f5f8;
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<tonk::SDKConnection>_*,_std::vector<std::shared_ptr<tonk::SDKConnection>,_std::allocator<std::shared_ptr<tonk::SDKConnection>_>_>_>
    ::operator++(&local_30);
  } while( true );
}

Assistant:

bool Insert(SDKConnection* connection)
    {
        std::lock_guard<std::mutex> locker(ConnectionListLock);
        for (auto& ii : ConnectionList)
            if (ii.get() == connection)
                return false;
        ConnectionList.push_back(connection->shared_from_this());
        return true;
    }